

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O1

void dump_2D_fdtd(fdtd2D *fdtd,char *fileName,dumpable_data what_to_dump)

{
  uintmax_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  FILE *__stream;
  void **ppvVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  undefined1 in_XMM3 [16];
  
  __stream = fopen(fileName,"w");
  if (what_to_dump - dump_ez < 6) {
    uVar1 = fdtd->sizeY;
    switch(what_to_dump) {
    case dump_ez:
      ppvVar4 = &fdtd->ez;
      break;
    case dump_hx:
      ppvVar4 = &fdtd->hx;
      break;
    case dump_hy:
      ppvVar4 = &fdtd->hy;
      break;
    case dump_hz:
      goto switchD_001042b6_caseD_5;
    case dump_permittivity:
      ppvVar4 = &fdtd->permittivity_inv;
      break;
    case dump_permeability:
      ppvVar4 = &fdtd->permeability_inv;
    }
    if (fdtd->sizeX != 0) {
      pvVar7 = *ppvVar4;
      uVar5 = 0;
      do {
        if (1 < fdtd->sizeY) {
          auVar2 = vcvtusi2sd_avx512f(in_XMM3,uVar5);
          uVar6 = 1;
          do {
            auVar3 = vcvtusi2sd_avx512f(in_XMM3,uVar6);
            fprintf(__stream,"%e %e %e\n",auVar2._0_8_ * fdtd->dx,auVar3._0_8_ * fdtd->dy,
                    *(undefined8 *)((long)pvVar7 + uVar6 * 8));
            uVar6 = uVar6 + 1;
          } while (uVar6 < fdtd->sizeY);
        }
        uVar5 = uVar5 + 1;
        pvVar7 = (void *)((long)pvVar7 + uVar1 * 8);
      } while (uVar5 < fdtd->sizeX);
    }
    fclose(__stream);
    return;
  }
switchD_001042b6_caseD_5:
  uVar5 = (ulong)what_to_dump;
  dump_2D_fdtd_cold_1();
  free(*(void **)(uVar5 + 0x18));
  free(*(void **)(uVar5 + 0x20));
  free(*(void **)(uVar5 + 0x28));
  free(*(void **)(uVar5 + 0x30));
  free(*(void **)(uVar5 + 0x38));
  free(*(void **)(uVar5 + 0xf0));
  free(*(void **)(uVar5 + 0xe8));
  free(*(void **)(uVar5 + 0x108));
  free(*(void **)(uVar5 + 0x100));
  free(*(void **)(uVar5 + 0x40));
  free(*(void **)(uVar5 + 0x48));
  free(*(void **)(uVar5 + 0x50));
  free(*(void **)(uVar5 + 0x58));
  lVar8 = 0;
  do {
    free(*(void **)(uVar5 + 0x60 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  free(*(void **)(uVar5 + 0x80));
  free(*(void **)(uVar5 + 0x90));
  return;
}

Assistant:

void dump_2D_fdtd(const struct fdtd2D *fdtd, const char *fileName,
                  enum dumpable_data what_to_dump) {
  FILE *out = fopen(fileName, "w");
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, data, fdtd->ez);
  switch (what_to_dump) {
  case dump_ez:
    break;
  case dump_hx:
    data = fdtd->hx;
    break;
  case dump_hy:
    data = fdtd->hy;
    break;
  case dump_permeability:
    data = fdtd->permeability_inv;
    break;
  case dump_permittivity:
    data = fdtd->permittivity_inv;
    break;
  default:
    fprintf(stderr, "Dump of \"%s\" not available for 2D fdtd\n",
            dumpable_data_name[what_to_dump]);
    exit(EXIT_FAILURE);
  }
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
    for (uintmax_t j = 1; j < fdtd->sizeY; ++j) {
      fprintf(out, "%e %e %e\n", (float_type)i * fdtd->dx,
              (float_type)j * fdtd->dy, data[i][j]);
    }
  }
  fclose(out);
}